

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffpdes(fitsfile *fptr,int colnum,LONGLONG rownum,LONGLONG length,LONGLONG heapaddr,int *status)

{
  int iVar1;
  int *status_00;
  long in_RCX;
  int in_ESI;
  int *in_RDI;
  fitsfile *in_R8;
  int *in_R9;
  int *unaff_retaddr;
  tcolumn *colptr;
  LONGLONG descript8 [2];
  uint descript4 [2];
  LONGLONG bytepos;
  int *in_stack_000000a0;
  fitsfile *in_stack_000000a8;
  long *in_stack_ffffffffffffff98;
  long in_stack_ffffffffffffffa8;
  fitsfile *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_4;
  
  if (*in_R9 < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_000000a8,in_stack_000000a0), 0 < iVar1)) {
        return *in_R9;
      }
    }
    else {
      ffmahd((fitsfile *)descript8[1],descript8[0]._4_4_,(int *)colptr,unaff_retaddr);
    }
    status_00 = (int *)(*(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_ESI + -1) * 0xa0);
    if (-1 < status_00[0x14]) {
      *in_R9 = 0x13d;
    }
    ffmbyt((fitsfile *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
           (LONGLONG)in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
           status_00);
    if (((char)status_00[0x23] == 'P') || (*(char *)((long)status_00 + 0x8d) == 'P')) {
      if ((0xffffffff < in_RCX) ||
         (((in_RCX < 0 || (0xffffffff < (long)in_R8)) || ((long)in_R8 < 0)))) {
        ffpmsg((char *)0x16bde0);
        *in_R9 = 0x19c;
        return *in_R9;
      }
      ffpi4b(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(long)status_00,
             (int *)in_stack_ffffffffffffff98,(int *)0x16be28);
    }
    else {
      ffpi8b(in_R8,in_RCX,(long)status_00,in_stack_ffffffffffffff98,(int *)0x16be5c);
    }
    local_4 = *in_R9;
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffpdes(fitsfile *fptr,  /* I - FITS file pointer                         */
           int colnum,      /* I - column number (1 = 1st column of table)   */
           LONGLONG rownum,     /* I - row number (1 = 1st row of table)         */
           LONGLONG length,    /* I - number of elements in the row             */
           LONGLONG heapaddr,  /* I - heap pointer to the data                  */
           int *status)     /* IO - error status                             */
/*
  put (write) the variable length vector descriptor to the table.
*/
{
    LONGLONG bytepos;
    unsigned int descript4[2];
    LONGLONG descript8[2];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */
    colptr += (colnum - 1);   /* offset to the correct column */

    if (colptr->tdatatype >= 0)
        *status = NOT_VARI_LEN;

    bytepos = (fptr->Fptr)->datastart + 
                  ((fptr->Fptr)->rowlength * (rownum - 1)) +
                  colptr->tbcol;

    ffmbyt(fptr, bytepos, IGNORE_EOF, status); /* move to element */

    if (colptr->tform[0] == 'P' || colptr->tform[1] == 'P')
    {
        if (length   > UINT_MAX || length   < 0 ||
            heapaddr > UINT_MAX || heapaddr < 0) {
            ffpmsg("P variable length column descriptor is out of range");
	    *status = NUM_OVERFLOW;
            return(*status);
        }
           
        descript4[0] = (unsigned int) length;   /* 1st word is the length  */
        descript4[1] = (unsigned int) heapaddr; /* 2nd word is the address */
 
        ffpi4b(fptr, 2, 4, (INT32BIT *) descript4, status); /* write the descriptor */
    }
    else /* this is a 'Q' descriptor column */
    {
        descript8[0] =  length;   /* 1st word is the length  */
        descript8[1] =  heapaddr; /* 2nd word is the address */
 
        ffpi8b(fptr, 2, 8, (long *) descript8, status); /* write the descriptor */
    }

    return(*status);
}